

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboNoAttachmentTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_0::checkFramebufferRenderable
               (TestLog *log,RenderContext *renderCtx,GLuint framebuffer,IVec2 *size)

{
  ostringstream *this;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  bool bVar3;
  GLuint vertexBuffer;
  allocator<char> local_2b9;
  GLuint vertexArray;
  GLuint query;
  float data [12];
  ShaderProgram program;
  long lVar2;
  
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  lVar2 = CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&query,
             "#version 310 es\nin layout(location = 0) highp vec2 a_position;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n}\n"
             ,(allocator<char> *)&vertexBuffer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexArray,
             "#version 310 es\nout layout(location = 0) mediump vec4 f_color;\n\nvoid main()\n{\n\tf_color = vec4(1.0, 0.5, 0.25, 1.0);\n}\n"
             ,&local_2b9);
  glu::makeVtxFragSources((ProgramSources *)data,(string *)&query,(string *)&vertexArray);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)data);
  glu::ProgramSources::~ProgramSources((ProgramSources *)data);
  std::__cxx11::string::~string((string *)&vertexArray);
  std::__cxx11::string::~string((string *)&query);
  query = 0;
  if (program.m_program.m_info.linkOk == false) {
    glu::operator<<(log,&program);
  }
  if ((program.m_program.m_info.linkOk & 1U) == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
               ,0xc6);
  }
  else {
    (**(code **)(lVar2 + 0x1680))(program.m_program.m_program);
    (**(code **)(lVar2 + 0x5e0))(0xb71);
    (**(code **)(lVar2 + 0x4a0))(0x207);
    (**(code **)(lVar2 + 0x78))(0x8ca9);
    (**(code **)(lVar2 + 0x1a00))(0,0,size->m_data[0],size->m_data[1]);
    iVar1 = (**(code **)(lVar2 + 0x170))(0x8ca9);
    if (iVar1 == 0x8cd5) {
      this = (ostringstream *)(data + 2);
      data._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(this);
      std::operator<<((ostream *)this,
                      "Rendering full framebuffer quad with color ouput, verifying output presence with occlusion query"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)data,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this);
      data[8] = 1.0;
      data[9] = -1.0;
      data[10] = -1.0;
      data[0xb] = -1.0;
      data[4] = -1.0;
      data[5] = 1.0;
      data[6] = -1.0;
      data[7] = 1.0;
      vertexArray = 0;
      data[0] = 1.0;
      data[1] = 1.0;
      data[2] = 1.0;
      data[3] = -1.0;
      vertexBuffer = 0;
      (**(code **)(lVar2 + 0x6e0))(1,&query);
      (**(code **)(lVar2 + 0x708))(1,&vertexArray);
      (**(code **)(lVar2 + 0xd8))(vertexArray);
      (**(code **)(lVar2 + 0x6c8))(1,&vertexBuffer);
      (**(code **)(lVar2 + 0x40))(0x8892,vertexBuffer);
      (**(code **)(lVar2 + 0x150))(0x8892,0x30,data,0x88e4);
      (**(code **)(lVar2 + 0x610))(0);
      (**(code **)(lVar2 + 0x19f0))(0,2,0x1406,0,0,0);
      (**(code **)(lVar2 + 0x20))(0x8c2f,query);
      (**(code **)(lVar2 + 0x538))(4,0,6);
      (**(code **)(lVar2 + 0x628))(0x8c2f);
      (**(code **)(lVar2 + 0x518))(0);
      (**(code **)(lVar2 + 0x40))(0x8892,0);
      (**(code **)(lVar2 + 0xd8))(0);
      (**(code **)(lVar2 + 0x438))(1,&vertexBuffer);
      (**(code **)(lVar2 + 0x490))(1,&vertexArray);
      vertexArray = 0;
      (**(code **)(lVar2 + 0xa20))(query,0x8866);
      (**(code **)(lVar2 + 0x458))(1,&query);
      err = (**(code **)(lVar2 + 0x800))();
      glu::checkError(err,"Query failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
                      ,0xfe);
      if (vertexArray == 0) {
        data._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(data + 2));
        std::operator<<((ostream *)(data + 2),"Query did not pass");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)data,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        data._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(data + 2));
        std::operator<<((ostream *)(data + 2),"Query passed");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)data,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(data + 2));
      bVar3 = vertexArray != 0;
      glu::ShaderProgram::~ShaderProgram(&program);
      return bVar3;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,
               "gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
               ,0xce);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool checkFramebufferRenderable (TestLog& log, const glu::RenderContext& renderCtx, GLuint framebuffer, const IVec2& size)
{
	const glw::Functions&		gl				= renderCtx.getFunctions();

	const char* const			vertexSource	= "#version 310 es\n"
												  "in layout(location = 0) highp vec2 a_position;\n\n"
												  "void main()\n"
												  "{\n"
												  "	gl_Position = vec4(a_position, 0.0, 1.0);\n"
												  "}\n";

	const char* const			fragmentSource	= "#version 310 es\n"
												  "out layout(location = 0) mediump vec4 f_color;\n\n"
												  "void main()\n"
												  "{\n"
												  "	f_color = vec4(1.0, 0.5, 0.25, 1.0);\n"
												  "}\n";

	const glu::ShaderProgram	program			(renderCtx, glu::makeVtxFragSources(vertexSource, fragmentSource));
	GLuint						query			= 0;

	if (!program.isOk())
		log << program;

	TCU_CHECK(program.isOk());

	gl.useProgram(program.getProgram());
	gl.enable(GL_DEPTH_TEST);
	gl.depthFunc(GL_ALWAYS);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, framebuffer);
	gl.viewport(0, 0, size.x(), size.y());

	TCU_CHECK(gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	log << TestLog::Message << "Rendering full framebuffer quad with color ouput, verifying output presence with occlusion query" << TestLog::EndMessage;

	// Render
	{
		const float data[] =
		{
			 1.0f,  1.0f,
			 1.0f, -1.0f,
			-1.0f,  1.0f,
			-1.0f,  1.0f,
			 1.0f, -1.0f,
			-1.0f, -1.0f,
		};

		GLuint vertexArray	= 0;
		GLuint vertexBuffer	= 0;

		gl.genQueries(1, &query);
		gl.genVertexArrays(1, &vertexArray);
		gl.bindVertexArray(vertexArray);

		gl.genBuffers(1, &vertexBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, vertexBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);

		gl.enableVertexAttribArray(0);
		gl.vertexAttribPointer(0, 2, GL_FLOAT, false, 0, DE_NULL);

		gl.beginQuery(GL_ANY_SAMPLES_PASSED, query);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		gl.endQuery(GL_ANY_SAMPLES_PASSED);

		gl.disableVertexAttribArray(0);
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		gl.bindVertexArray(0);
		gl.deleteBuffers(1, &vertexBuffer);
		gl.deleteVertexArrays(1, &vertexArray);
	}

	// Read
	{
		GLuint passed = 0;

		gl.getQueryObjectuiv(query, GL_QUERY_RESULT, &passed);
		gl.deleteQueries(1, &query);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Query failed");

		if (passed)
			log << TestLog::Message << "Query passed" << TestLog::EndMessage;
		else
			log << TestLog::Message << "Query did not pass" << TestLog::EndMessage;

		return passed != 0;
	}
}